

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O1

loader_impl_data mock_loader_impl_initialize(loader_impl impl,configuration config)

{
  int iVar1;
  undefined8 *__ptr;
  
  __ptr = (undefined8 *)malloc(8);
  if (__ptr != (undefined8 *)0x0) {
    iVar1 = mock_loader_impl_initialize_types(impl);
    if (iVar1 == 0) {
      *__ptr = 0;
      loader_initialization_register(impl);
      return __ptr;
    }
    free(__ptr);
  }
  return (loader_impl_data)0x0;
}

Assistant:

loader_impl_data mock_loader_impl_initialize(loader_impl impl, configuration config)
{
	loader_impl_mock mock_impl;

	(void)impl;
	(void)config;

	mock_impl = malloc(sizeof(struct loader_impl_mock_type));

	if (mock_impl == NULL)
	{
		return NULL;
	}

	if (mock_loader_impl_initialize_types(impl) != 0)
	{
		free(mock_impl);

		return NULL;
	}

	mock_impl->impl_mock_data = NULL;

	/* Register initialization */
	loader_initialization_register(impl);

	return mock_impl;
}